

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_char,_2U> * __thiscall
ImageT<unsigned_char,2u>::copyTo<ImageT<unsigned_char,2u>>
          (ImageT<unsigned_char,_2U> *this,ImageT<unsigned_char,_2U> *dst,string_view swizzle)

{
  _func_int **pp_Var1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  Image *in_RSI;
  ImageT<unsigned_char,_2U> *in_RDI;
  bool bVar8;
  uint32_t c;
  size_t i;
  char in_stack_ffffffffffffff7f;
  color<unsigned_char,_2U> *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  uint local_2c;
  ulong local_28;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  iVar3 = (*(in_RDI->super_Image)._vptr_Image[6])();
  iVar4 = (*in_RSI->_vptr_Image[6])();
  if (iVar3 != iVar4) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned char, 2>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 2, DstImage = ImageT<unsigned char, 2>]"
                 );
  }
  uVar6 = (in_RDI->super_Image).width;
  uVar5 = Image::getWidth(in_RSI);
  bVar8 = false;
  if (uVar6 == uVar5) {
    uVar6 = (in_RDI->super_Image).height;
    uVar5 = Image::getHeight(in_RSI);
    bVar8 = uVar6 == uVar5;
  }
  if (bVar8) {
    Image::setTransferFunction(in_RSI,(in_RDI->super_Image).transferFunction);
    Image::setPrimaries(in_RSI,(in_RDI->super_Image).primaries);
    for (local_28 = 0; uVar6 = Image::getPixelCount(&in_RDI->super_Image), local_28 < uVar6;
        local_28 = local_28 + 1) {
      for (local_2c = 0;
          (uVar7 = (*in_RSI->_vptr_Image[5])(), local_2c < uVar7 &&
          (uVar7 = (*(in_RDI->super_Image)._vptr_Image[5])(), local_2c < uVar7));
          local_2c = local_2c + 1) {
        pp_Var1 = in_RSI[1]._vptr_Image;
        std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_10,(ulong)local_2c)
        ;
        uVar2 = ImageT<unsigned_char,_2U>::swizzlePixel
                          ((ImageT<unsigned_char,_2U> *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
        color<unsigned_char,_2U>::set
                  ((color<unsigned_char,_2U> *)((long)pp_Var1 + local_28 * 2),local_2c,uVar2);
      }
      while (in_stack_ffffffffffffff8c = local_2c, uVar7 = (*in_RSI->_vptr_Image[5])(),
            in_stack_ffffffffffffff8c < uVar7) {
        if (local_2c < 3) {
          color<unsigned_char,_2U>::set
                    ((color<unsigned_char,_2U> *)((long)in_RSI[1]._vptr_Image + local_28 * 2),
                     local_2c,'\0');
        }
        else {
          in_stack_ffffffffffffff80 =
               (color<unsigned_char,_2U> *)((long)in_RSI[1]._vptr_Image + local_28 * 2);
          in_stack_ffffffffffffff88 = local_2c;
          uVar2 = color_base<unsigned_char,_2U>::one();
          color<unsigned_char,_2U>::set(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,uVar2);
        }
        local_2c = local_2c + 1;
      }
    }
    return in_RDI;
  }
  __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x50b,
                "ImageT<componentType, componentCount> &ImageT<unsigned char, 2>::copyTo(DstImage &, std::string_view) [componentType = unsigned char, componentCount = 2, DstImage = ImageT<unsigned char, 2>]"
               );
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }